

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O3

gc_heap_ptr<mjs::function_object> __thiscall
mjs::make_raw_function(mjs *this,gc_heap_ptr<mjs::global_object> *global)

{
  int iVar1;
  gc_heap *num_bytes;
  long *plVar2;
  void *pvVar3;
  function_object *this_00;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::function_object> gVar4;
  gc_heap_ptr<mjs::function_object> *o;
  object_ptr fp;
  undefined1 local_50 [32];
  
  plVar2 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar2 + 0x60))((gc_heap_ptr_untyped *)(local_50 + 0x10),plVar2);
  num_bytes = (global->super_gc_heap_ptr_untyped).heap_;
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_50 + 0x10));
  object::class_name((object *)local_50);
  gc_heap::
  allocate_and_construct<mjs::function_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)this,(size_t)num_bytes,(gc_heap_ptr<mjs::global_object> *)0x48,
             (string *)global,(gc_heap_ptr<mjs::object> *)local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
  pvVar3 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  iVar1 = *(int *)((long)pvVar3 + 0x20);
  this_00 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::make_object((global_object *)local_50);
  function_object::put_prototype_with_attributes
            (this_00,(object_ptr *)local_50,(uint)(iVar1 != 1) * 2 + (uint)(0 < iVar1) * 4);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_50 + 0x10));
  gVar4.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::function_object>)gVar4.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<function_object> make_raw_function(const gc_heap_ptr<global_object>& global) {
    auto fp = global->function_prototype();
    auto o = global.heap().make<function_object>(global, fp->class_name(), fp);
    const auto ver = global->language_version();
    const auto attrs =
        (ver != version::es3 ? property_attribute::dont_enum : property_attribute::none)
        | (ver >= version::es3 ? property_attribute::dont_delete : property_attribute::none);
    o->put_prototype_with_attributes(global->make_object(),  attrs);
    return o;
}